

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

uint64_t fio_risky_hash(void *data_,size_t len,uint64_t seed)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar7 = len ^ 0xab137439982b86c9;
  lVar5 = ~len + 0xab137439982b86c9;
  uVar4 = (len << 0x11 | len >> 0x2f) ^ 0x50a6cb67c2f68a71;
  uVar1 = (len << 0x21 | len >> 0x1f) + 0x54ec8bc667d47936;
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 0x20) {
    uVar9 = *(ulong *)((long)data_ + lVar3);
    uVar2 = *(ulong *)((long)data_ + lVar3 + 8);
    uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
            (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    uVar7 = uVar7 + uVar9;
    uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    uVar6 = lVar5 + uVar2;
    uVar7 = ((uVar7 << 0x21 | uVar7 >> 0x1f) + uVar9) * -0x445c05ea4ddeec5;
    uVar9 = *(ulong *)((long)data_ + lVar3 + 0x10);
    uVar10 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    uVar4 = uVar4 + uVar10;
    lVar5 = ((uVar6 << 0x21 | uVar6 >> 0x1f) + uVar2) * -0x445c05ea4ddeec5;
    uVar9 = *(ulong *)((long)data_ + lVar3 + 0x18);
    uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
            (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    uVar1 = uVar1 + uVar9;
    uVar4 = ((uVar4 << 0x21 | uVar4 >> 0x1f) + uVar10) * -0x445c05ea4ddeec5;
    uVar1 = ((uVar1 << 0x21 | uVar1 >> 0x1f) + uVar9) * -0x445c05ea4ddeec5;
  }
  uVar9 = *(ulong *)((long)data_ + 0x80);
  uVar2 = *(ulong *)((long)data_ + 0x88);
  uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
          (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
          (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  uVar7 = uVar7 + uVar9;
  lVar8 = (uVar7 << 0x21 | uVar7 >> 0x1f) + uVar9;
  uVar7 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar9 = lVar5 + uVar7;
  lVar3 = (uVar9 << 0x21 | uVar9 >> 0x1f) + uVar7;
  uVar7 = lVar8 * -0x7536c3408ddc96ad + ((ulong)(lVar8 * -0x445c05ea4ddeec5) >> 0x2f) +
          (uVar1 << 0x39 | uVar1 >> 7) + (uVar4 << 0x2f | uVar4 >> 0x11) +
          lVar3 * 0x47f42b6442276000 + ((ulong)(lVar3 * -0x445c05ea4ddeec5) >> 0x33) + 0x12000000090
  ;
  uVar7 = lVar3 * 0xb86867b4fad6953 + ((uVar7 * 0x2000 | uVar7 >> 0x33) ^ uVar7);
  uVar4 = uVar4 * -0x54ec8bc667d47937 + ((uVar7 * 0x20000000 | uVar7 >> 0x23) ^ uVar7);
  uVar1 = uVar1 * -0x54ec8bc667d47937 + ((uVar4 << 0x21 | uVar4 >> 0x1f) ^ uVar4);
  uVar1 = (uVar1 << 0x33 | uVar1 >> 0xd) ^ uVar1;
  return (uVar1 >> 0x1d) * -0x445c05ea4ddeec5 ^ uVar1;
}

Assistant:

FIO_FUNC inline uint64_t fio_risky_hash(const void *data_, size_t len,
                                        uint64_t seed) {
  /* reading position */
  const uint8_t *data = (uint8_t *)data_;

  /* The consumption vectors initialized state */
  register uint64_t v0 = seed ^ RISKY_PRIME_1;
  register uint64_t v1 = ~seed + RISKY_PRIME_1;
  register uint64_t v2 =
      fio_lrot64(seed, 17) ^ ((~RISKY_PRIME_1) + RISKY_PRIME_0);
  register uint64_t v3 = fio_lrot64(seed, 33) + (~RISKY_PRIME_1);

  /* consume 256 bit blocks */
  for (size_t i = len >> 5; i; --i) {
    fio_risky_consume(v0, fio_str2u64(data));
    fio_risky_consume(v1, fio_str2u64(data + 8));
    fio_risky_consume(v2, fio_str2u64(data + 16));
    fio_risky_consume(v3, fio_str2u64(data + 24));
    data += 32;
  }

  /* Consume any remaining 64 bit words. */
  switch (len & 24) {
  case 24:
    fio_risky_consume(v2, fio_str2u64(data + 16));
    /* fallthrough */
  case 16:
    fio_risky_consume(v1, fio_str2u64(data + 8));
    /* fallthrough */
  case 8:
    fio_risky_consume(v0, fio_str2u64(data));
    data += len & 24;
  }

  uint64_t tmp = 0;
  /* consume leftover bytes, if any */
  switch ((len & 7)) {
  case 7:
    tmp |= ((uint64_t)data[6]) << 8;
    /* fallthrough */
  case 6:
    tmp |= ((uint64_t)data[5]) << 16;
    /* fallthrough */
  case 5:
    tmp |= ((uint64_t)data[4]) << 24;
    /* fallthrough */
  case 4:
    tmp |= ((uint64_t)data[3]) << 32;
    /* fallthrough */
  case 3:
    tmp |= ((uint64_t)data[2]) << 40;
    /* fallthrough */
  case 2:
    tmp |= ((uint64_t)data[1]) << 48;
    /* fallthrough */
  case 1:
    tmp |= ((uint64_t)data[0]) << 56;
    /* ((len >> 3) & 3) is a 0...3 value indicating consumption vector */
    switch ((len >> 3) & 3) {
    case 3:
      fio_risky_consume(v3, tmp);
      break;
    case 2:
      fio_risky_consume(v2, tmp);
      break;
    case 1:
      fio_risky_consume(v1, tmp);
      break;
    case 0:
      fio_risky_consume(v0, tmp);
      break;
    }
  }

  /* merge and mix */
  uint64_t result = fio_lrot64(v0, 17) + fio_lrot64(v1, 13) +
                    fio_lrot64(v2, 47) + fio_lrot64(v3, 57);

  len ^= (len << 33);
  result += len;

  result += v0 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 13);
  result += v1 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 29);
  result += v2 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 33);
  result += v3 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 51);

  /* irreversible avalanche... I think */
  result ^= (result >> 29) * RISKY_PRIME_0;
  return result;
}